

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::error_info_injector<boost::lock_error>::error_info_injector
          (error_info_injector<boost::lock_error> *this,lock_error *x)

{
  lock_error *in_RDI;
  exception *in_stack_ffffffffffffffe0;
  
  lock_error::lock_error((lock_error *)in_stack_ffffffffffffffe0,in_RDI);
  exception::exception(in_stack_ffffffffffffffe0);
  *(undefined ***)&(in_RDI->super_thread_exception).super_system_error =
       &PTR__error_info_injector_003058b0;
  *(undefined ***)&in_RDI[1].super_thread_exception.super_system_error =
       &PTR__error_info_injector_003058d8;
  return;
}

Assistant:

explicit
            error_info_injector( T const & x ):
                T(x)
                {
                }